

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook_state.cpp
# Opt level: O2

void __thiscall
HookStateStepOver::ProcessHook
          (HookStateStepOver *this,shared_ptr<Debugger> *debugger,lua_State *L,lua_Debug *ar)

{
  bool bVar1;
  int iVar2;
  char *__lhs;
  lua_Debug *ar_00;
  __shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  __shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  ar_00 = ar;
  std::__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_48,&debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>);
  StackLevelBasedState::UpdateStackLevel
            (&this->super_StackLevelBasedState,(shared_ptr<Debugger> *)&_Stack_48,L,ar_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  if ((this->super_StackLevelBasedState).newStackLevel <
      (this->super_StackLevelBasedState).oriStackLevel) {
LAB_0015c578:
    Debugger::HandleBreak
              ((debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  }
  else {
    iVar2 = getDebugEvent(ar);
    if (iVar2 == 2) {
      iVar2 = getDebugCurrentLine(ar);
      if ((iVar2 != this->line) &&
         ((this->super_StackLevelBasedState).newStackLevel ==
          (this->super_StackLevelBasedState).oriStackLevel)) {
        (*lua_getinfo)(L,"Sl",ar);
        __lhs = getDebugSource(ar);
        bVar1 = std::operator==(__lhs,&this->file);
        if ((bVar1) || (this->line == -1)) goto LAB_0015c578;
      }
    }
    std::__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,&debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  }
  return;
}

Assistant:

void HookStateStepOver::ProcessHook(std::shared_ptr<Debugger> debugger, lua_State* L, lua_Debug* ar)
{
	UpdateStackLevel(debugger, L, ar);
	// step out
	if (newStackLevel < oriStackLevel)
	{
		debugger->HandleBreak();
		return;
	}


	if (getDebugEvent(ar) == LUA_HOOKLINE &&
		getDebugCurrentLine(ar) != line &&
		newStackLevel == oriStackLevel)
	{
		lua_getinfo(L, "Sl", ar);

		if (getDebugSource(ar) == file || line == -1)
		{
			debugger->HandleBreak();
			return;
		}
	}
	StackLevelBasedState::ProcessHook(debugger, L, ar);
}